

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeFramesQueue.hpp
# Opt level: O3

bool __thiscall
ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>::Pop
          (ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
           *this,pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *out)

{
  _Elt_pointer ppVar1;
  _Elt_pointer ppVar2;
  int iVar3;
  int64 iVar4;
  undefined8 uVar5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar3 == 0) {
    ppVar1 = (this->
             super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
             ).c.
             super__Deque_base<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar2 = (this->
             super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
             ).c.
             super__Deque_base<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar2 != ppVar1) {
      cv::Mat::operator=(&out->first,&ppVar1->first);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator=(&out->second,&ppVar1->second);
      std::
      deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
      ::pop_front((deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
                   *)this);
      cv::TickMeter::stop(&this->tm);
      iVar4 = cv::getTickCount();
      (this->tm).startTime = iVar4;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return ppVar2 != ppVar1;
  }
  uVar5 = std::__throw_system_error(iVar3);
  __clang_call_terminate(uVar5);
}

Assistant:

bool Pop(T& out) noexcept {
    std::lock_guard<std::mutex> lock(mtx);
    //! if the queue is empty, just exit
    if (this->empty()) {
      return false;
    }
    //! get the first element, and remove it
    out = this->front();
    this->pop();
    //! stop the current timer
    tm.stop();
    //! start the next timer
    tm.start();
    //! return true, indicating successful pop
    return true;
  }